

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsum.c
# Opt level: O2

bool_t bsumHidIsValid(size_t hid)

{
  undefined1 auVar1 [16];
  uint uVar2;
  
  uVar2 = 1;
  if ((hid != 0) && (0x200 < hid || (hid & 0x1f) != 0)) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = hid;
    uVar2 = 0;
    if ((hid % 10 - 1 < 2) &&
       ((0x9ff < hid && ((auVar1 / ZEXT816(10) & (undefined1  [16])0x7f) == (undefined1  [16])0x0)))
       ) {
      uVar2 = (uint)(hid < 0x1900);
    }
  }
  return uVar2;
}

Assistant:

static bool_t bsumHidIsValid(size_t hid)
{
	return hid == 0 ||
		(hid <= 512 && hid % 32 == 0) ||
		(hid % 10 != 0 && hid % 10 <= 2 &&
			(hid / 10) % 128 == 0 && 2 <= hid / 1280 && hid / 1280 <= 4);
}